

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int arena_i_retain_grow_limit_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  _Bool _Var1;
  uint ind;
  uint uVar2;
  arena_t *new_limit_00;
  undefined8 *in_RCX;
  long in_RSI;
  malloc_mutex_t *in_RDI;
  ulong *in_R8;
  long in_R9;
  long in_stack_00000008;
  size_t copylen;
  _Bool err;
  size_t new_limit;
  size_t old_limit;
  arena_t *arena;
  uint arena_ind;
  int ret;
  size_t local_a8;
  malloc_mutex_t *in_stack_ffffffffffffff68;
  arena_t *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  arena_t *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined8 local_68;
  arena_t *local_60;
  uint local_58;
  int local_54;
  long local_50;
  ulong *local_48;
  undefined8 *local_40;
  long local_30;
  malloc_mutex_t *local_28;
  malloc_mutex_t *local_18;
  malloc_mutex_t *local_10;
  
  if (!opt_retain) {
    return 2;
  }
  local_50 = in_R9;
  local_48 = in_R8;
  local_40 = in_RCX;
  local_30 = in_RSI;
  local_28 = in_RDI;
  malloc_mutex_lock((tsdn_t *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                    (malloc_mutex_t *)in_stack_ffffffffffffff70);
  if (0xffffffff < *(ulong *)(local_30 + 8)) {
    local_54 = 0xe;
    goto LAB_0014d127;
  }
  ind = (uint)*(undefined8 *)(local_30 + 8);
  local_58 = ind;
  uVar2 = narenas_total_get();
  if (ind < uVar2) {
    local_10 = local_28;
    new_limit_00 = arena_get((tsdn_t *)in_stack_ffffffffffffff80,ind,
                             SUB41((uint)in_stack_ffffffffffffff78 >> 0x18,0));
    local_60 = new_limit_00;
    if (new_limit_00 != (arena_t *)0x0) {
      if (((local_50 == 0) || (local_50 == 0)) || (in_stack_00000008 == 8)) {
        in_stack_ffffffffffffff68 = local_28;
        _Var1 = arena_retain_grow_limit_get_set
                          ((tsd_t *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                           in_stack_ffffffffffffff80,
                           (size_t *)CONCAT44(ind,in_stack_ffffffffffffff78),(size_t *)new_limit_00)
        ;
        in_stack_ffffffffffffff70 = new_limit_00;
        if (_Var1) {
          local_54 = 0xe;
        }
        else {
          if ((local_40 != (undefined8 *)0x0) && (local_48 != (ulong *)0x0)) {
            if (*local_48 != 8) {
              if (*local_48 < 8) {
                local_a8 = *local_48;
              }
              else {
                local_a8 = 8;
              }
              memcpy(local_40,&local_68,local_a8);
              local_54 = 0x16;
              in_stack_ffffffffffffff70 = new_limit_00;
              goto LAB_0014d127;
            }
            *local_40 = local_68;
          }
          local_54 = 0;
        }
      }
      else {
        local_54 = 0x16;
      }
      goto LAB_0014d127;
    }
  }
  local_54 = 0xe;
LAB_0014d127:
  local_18 = local_28;
  malloc_mutex_unlock((tsdn_t *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  return local_54;
}

Assistant:

static int
arena_i_retain_grow_limit_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;
	unsigned arena_ind;
	arena_t *arena;

	if (!opt_retain) {
		/* Only relevant when retain is enabled. */
		return ENOENT;
	}

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	MIB_UNSIGNED(arena_ind, 1);
	if (arena_ind < narenas_total_get() && (arena =
	    arena_get(tsd_tsdn(tsd), arena_ind, false)) != NULL) {
		size_t old_limit, new_limit;
		if (newp != NULL) {
			WRITE(new_limit, size_t);
		}
		bool err = arena_retain_grow_limit_get_set(tsd, arena,
		    &old_limit, newp != NULL ? &new_limit : NULL);
		if (!err) {
			READ(old_limit, size_t);
			ret = 0;
		} else {
			ret = EFAULT;
		}
	} else {
		ret = EFAULT;
	}
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}